

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void util::TraceThread(string_view thread_name,function<void_()> *thread_func)

{
  long lVar1;
  string_view logging_function;
  string_view logging_function_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  Level in_stack_000000a0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000000b0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffefc;
  allocator<char> *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  LogFlags in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  ConstevalFormatString<1U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RDX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ThreadRename(in_RDX);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDX,
             (char *)in_stack_ffffffffffffff10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDX,
             (char *)in_stack_ffffffffffffff10);
  uVar2 = 2;
  logging_function._M_str = in_RDI;
  logging_function._M_len = in_stack_ffffffffffffffc0;
  LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff60,in_stack_000000a0,in_stack_ffffffffffffffa8,in_stack_000000b0
            );
  std::function<void_()>::operator()((function<void_()> *)CONCAT44(in_stack_fffffffffffffefc,uVar2))
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDX,
             (char *)in_stack_ffffffffffffff10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDX,
             (char *)in_stack_ffffffffffffff10);
  logging_function_00._M_str = in_RDI;
  logging_function_00._M_len = in_stack_ffffffffffffffc0;
  LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff60,in_stack_000000a0,in_stack_ffffffffffffffa8,in_stack_000000b0
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void util::TraceThread(std::string_view thread_name, std::function<void()> thread_func)
{
    util::ThreadRename(std::string{thread_name});
    try {
        LogPrintf("%s thread start\n", thread_name);
        thread_func();
        LogPrintf("%s thread exit\n", thread_name);
    } catch (const std::exception& e) {
        PrintExceptionContinue(&e, thread_name);
        throw;
    } catch (...) {
        PrintExceptionContinue(nullptr, thread_name);
        throw;
    }
}